

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cc
# Opt level: O2

Token __thiscall flow::lang::Lexer::parseIdent(Lexer *this)

{
  string *__lhs;
  ulong uVar1;
  char *__s2;
  bool bVar2;
  bool bVar3;
  int iVar4;
  Token TVar5;
  int iVar6;
  Token *pTVar7;
  
  (this->stringValue_)._M_string_length = 0;
  __lhs = &this->stringValue_;
  *(this->stringValue_)._M_dataplus._M_p = '\0';
  std::__cxx11::string::push_back((char)__lhs);
  bVar2 = isHexChar(this);
  TVar5 = Boolean;
  while( true ) {
    nextChar(this,true);
    iVar6 = this->currentChar_;
    iVar4 = isalnum(iVar6);
    if (((iVar4 == 0) && (iVar6 != 0x5f)) && (iVar6 != 0x2e)) break;
    std::__cxx11::string::push_back((char)__lhs);
    bVar3 = isHexChar(this);
    if (!bVar3) {
      bVar2 = false;
    }
  }
  if ((iVar6 == 0x3a) && (bVar2 == false)) {
    nextChar(this,true);
    TVar5 = NamedParam;
  }
  else {
    uVar1 = (this->stringValue_)._M_string_length;
    if (uVar1 < 5) {
      if (iVar6 == 0x3a && (~bVar2 & 1U) == 0) {
        bVar2 = true;
LAB_0012c5c9:
        TVar5 = continueParseIPv6(this,bVar2);
        return TVar5;
      }
      if ((uVar1 != 4 && (~bVar2 & 1U) == 0) && (bVar2 = isHexChar(this), bVar2)) {
        bVar2 = false;
        goto LAB_0012c5c9;
      }
    }
    __s2 = (__lhs->_M_dataplus)._M_p;
    for (pTVar7 = &parseIdent::keywords[0].token;
        ((anon_struct_16_2_6b51f6ec *)(pTVar7 + -2))->symbol != (char *)0x0; pTVar7 = pTVar7 + 4) {
      iVar6 = strcmp(((anon_struct_16_2_6b51f6ec *)(pTVar7 + -2))->symbol,__s2);
      if (iVar6 == 0) {
        TVar5 = *pTVar7;
        this->token_ = TVar5;
        return TVar5;
      }
    }
    bVar2 = std::operator==(__lhs,"true");
    if ((bVar2) || (bVar2 = std::operator==(__lhs,"yes"), bVar2)) {
      this->numberValue_ = 1;
    }
    else {
      bVar2 = std::operator==(__lhs,"false");
      if ((!bVar2) && (bVar2 = std::operator==(__lhs,"no"), !bVar2)) {
        this->token_ = Ident;
        return Ident;
      }
      this->numberValue_ = 0;
    }
    this->token_ = Boolean;
  }
  return TVar5;
}

Assistant:

Token Lexer::parseIdent() {
  stringValue_.clear();
  stringValue_ += static_cast<char>(currentChar());
  bool isHex = isHexChar();

  nextChar();

  while (std::isalnum(currentChar()) || currentChar() == '_' ||
         currentChar() == '.') {
    stringValue_ += static_cast<char>(currentChar());
    if (!isHexChar()) isHex = false;

    nextChar();
  }

  if (currentChar() == ':' && !isHex) {
    nextChar();  // skip ':'
    return Token::NamedParam;
  }

  // ipv6HexDigit4 *(':' ipv6HexDigit4) ['::' [ipv6HexSeq]]
  if (stringValue_.size() <= 4 && isHex && currentChar() == ':')
    return continueParseIPv6(true);

  if (stringValue_.size() < 4 && isHex && isHexChar())
    return continueParseIPv6(false);

  static struct {
    const char* symbol;
    Token token;
  } keywords[] = {{"in", Token::In},
                  {"var", Token::Var},
                  {"match", Token::Match},
                  {"on", Token::On},
                  {"for", Token::For},
                  {"do", Token::Do},
                  {"if", Token::If},
                  {"then", Token::Then},
                  {"else", Token::Else},
                  {"while", Token::While},
                  {"unless", Token::Unless},
                  {"import", Token::Import},
                  {"from", Token::From},
                  {"handler", Token::Handler},
                  {"and", Token::And},
                  {"or", Token::Or},
                  {"xor", Token::Xor},
                  {"not", Token::Not},
                  {"shl", Token::Shl},
                  {"shr", Token::Shr},
                  {"bool", Token::BoolType},
                  {"int", Token::NumberType},
                  {"string", Token::StringType},
                  {nullptr, Token::Unknown}};

  for (auto i = keywords; i->symbol; ++i)
    if (strcmp(i->symbol, stringValue_.c_str()) == 0) return token_ = i->token;

  if (stringValue_ == "true" || stringValue_ == "yes") {
    numberValue_ = 1;
    return token_ = Token::Boolean;
  }

  if (stringValue_ == "false" || stringValue_ == "no") {
    numberValue_ = 0;
    return token_ = Token::Boolean;
  }

  return token_ = Token::Ident;
}